

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O2

int __thiscall MeCab::CharProperty::open(CharProperty *this,char *__file,int __oflag,...)

{
  Mmap<char> *pMVar1;
  int *piVar2;
  pointer ppcVar3;
  int iVar4;
  ostream *poVar5;
  char *r;
  CharInfo *pCVar6;
  bool bVar7;
  char *s;
  ostringstream error;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  iVar4 = Mmap<char>::open((this->cmmap_).ptr_,__file,0x183d26);
  if ((char)iVar4 == '\0') {
    wlog::wlog((wlog *)&s,&this->what_);
    poVar5 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x52);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"cmmap_->open(filename, \"r\")");
    std::operator<<(poVar5,"] ");
  }
  else {
    pMVar1 = (this->cmmap_).ptr_;
    piVar2 = (int *)pMVar1->text;
    iVar4 = *piVar2;
    if ((ulong)(uint)(iVar4 << 5) + 0x40000 == pMVar1->length) {
      ppcVar3 = (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppcVar3) {
        (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppcVar3;
      }
      pCVar6 = (CharInfo *)(piVar2 + 1);
      while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
        s = (char *)pCVar6;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&this->clist_,&s);
        pCVar6 = pCVar6 + 8;
      }
      this->map_ = pCVar6;
      iVar4 = (int)CONCAT71((int7)((ulong)&this->clist_ >> 8),1);
      goto LAB_0015d075;
    }
    wlog::wlog((wlog *)&s,&this->what_);
    poVar5 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x5b);
    poVar5 = std::operator<<(poVar5,") [");
    poVar5 = std::operator<<(poVar5,"fsize == cmmap_->size()");
    poVar5 = std::operator<<(poVar5,"] ");
    poVar5 = std::operator<<(poVar5,"invalid file size: ");
    std::operator<<(poVar5,__file);
  }
  iVar4 = 0;
LAB_0015d075:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return iVar4;
}

Assistant:

bool CharProperty::open(const char *filename) {
  std::ostringstream error;
  CHECK_FALSE(cmmap_->open(filename, "r"));

  const char *ptr = cmmap_->begin();
  unsigned int csize;
  read_static<unsigned int>(&ptr, csize);

  size_t fsize = sizeof(unsigned int) +
      (32 * csize) + sizeof(unsigned int) * 0xffff;

  CHECK_FALSE(fsize == cmmap_->size())
      << "invalid file size: " << filename;

  clist_.clear();
  for (unsigned int i = 0; i < csize; ++i) {
    const char *s = read_ptr(&ptr, 32);
    clist_.push_back(s);
  }

  map_ = reinterpret_cast<const CharInfo *>(ptr);

  return true;
}